

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patcher.cpp
# Opt level: O2

void search_and_patch_r(string *indent,uint8_t *cstart,uint8_t *cend,pattern_t *pattern)

{
  uchar uVar1;
  uchar uVar2;
  pointer puVar3;
  pointer puVar4;
  uchar *puVar5;
  pattern_t *ppVar6;
  uchar *__first1;
  ostream *poVar7;
  uchar *puVar8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var9;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var10;
  uchar *puVar11;
  uchar uVar12;
  pointer ppVar13;
  uint8_t wildcard;
  pattern_s child;
  uint8_t local_1ad;
  int local_1ac;
  uchar *local_1a8;
  pattern_t *local_1a0;
  pointer local_198;
  string local_190;
  pattern_s local_170;
  pattern_s local_d0;
  
  local_1ad = pattern->wildcard;
  uVar1 = pattern->replace_wildcard;
  _Var10._M_current =
       (pattern->patt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var9._M_current =
       (pattern->patt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1ac = 0;
  local_1a8 = cend;
  local_1a0 = pattern;
  do {
    ppVar6 = local_1a0;
    puVar8 = local_1a8;
    __first1 = std::
               search<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,search_and_patch_r(std::__cxx11::string,unsigned_char*,unsigned_char*,pattern_s)::__0>
                         (cstart,local_1a8,_Var10,_Var9,(anon_class_8_1_a2015b58)&local_1ad);
    if (puVar8 <= __first1) {
      if (local_1ac == 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)indent);
        poVar7 = std::operator<<(poVar7,"Warning: <");
        poVar7 = std::operator<<(poVar7,(string *)ppVar6);
        poVar7 = std::operator<<(poVar7,"> was not found!");
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      return;
    }
    poVar7 = std::operator<<((ostream *)&std::cout,(string *)indent);
    poVar7 = std::operator<<(poVar7,"Found <");
    poVar7 = std::operator<<(poVar7,(string *)ppVar6);
    poVar7 = std::operator<<(poVar7,"> at 0x");
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    _Var10._M_current =
         (ppVar6->validate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    _Var9._M_current =
         (ppVar6->validate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (ppVar6->replace).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (ppVar6->replace).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (_Var10._M_current == _Var9._M_current) {
      if (puVar3 != puVar4) {
LAB_0010457e:
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)indent);
        poVar7 = std::operator<<(poVar7,"Patching...");
        std::endl<char,std::char_traits<char>>(poVar7);
        puVar5 = (ppVar6->replace).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar11 = __first1 + ppVar6->replace_offset;
        for (puVar8 = (ppVar6->replace).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start; puVar8 != puVar5; puVar8 = puVar8 + 1) {
          uVar2 = *puVar8;
          uVar12 = *puVar11;
          if (uVar1 != uVar2) {
            uVar12 = uVar2;
          }
          if (uVar1 == '\0') {
            uVar12 = uVar2;
          }
          *puVar11 = uVar12;
          puVar11 = puVar11 + 1;
        }
      }
    }
    else if (puVar3 != puVar4) {
      puVar8 = std::
               search<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,search_and_patch_r(std::__cxx11::string,unsigned_char*,unsigned_char*,pattern_s)::__0>
                         (__first1,__first1 +
                                   (long)(_Var9._M_current + (5 - (long)_Var10._M_current)),_Var10,
                          _Var9,(anon_class_8_1_a2015b58)&local_1ad);
      if ((puVar8 < __first1 + (long)(_Var9._M_current + (5 - (long)_Var10._M_current))) ||
         ((force_invalid & 1U) != 0)) goto LAB_0010457e;
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)indent);
      poVar7 = std::operator<<(poVar7,
                               "Can\'t apply patch! (search region don\'t pass validation), use -force_invalid to force."
                              );
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    ppVar13 = (ppVar6->childs).super__Vector_base<pattern_s,_std::allocator<pattern_s>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_198 = (ppVar6->childs).super__Vector_base<pattern_s,_std::allocator<pattern_s>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (ppVar13 != local_198) {
      for (; ppVar13 != local_198; ppVar13 = ppVar13 + 1) {
        pattern_s::pattern_s(&local_170,ppVar13);
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)indent);
        poVar7 = std::operator<<(poVar7,"Scanning SUB:<");
        poVar7 = std::operator<<(poVar7,(string *)&local_170);
        poVar7 = std::operator<<(poVar7,">");
        std::endl<char,std::char_traits<char>>(poVar7);
        puVar8 = __first1 + local_170.max_search;
        if (local_170.max_search == 0) {
          puVar8 = local_1a8;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (indent,"...");
        std::__cxx11::string::string((string *)&local_190,indent);
        pattern_s::pattern_s(&local_d0,&local_170);
        search_and_patch_r(&local_190,__first1,puVar8,&local_d0);
        pattern_s::~pattern_s(&local_d0);
        std::__cxx11::string::~string((string *)&local_190);
        pattern_s::~pattern_s(&local_170);
      }
    }
    local_1ac = local_1ac + 1;
    _Var10._M_current =
         (local_1a0->patt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_start;
    _Var9._M_current =
         (local_1a0->patt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
    cstart = __first1 + ((long)_Var9._M_current - (long)_Var10._M_current);
  } while( true );
}

Assistant:

void search_and_patch_r(string indent, uint8_t* cstart, uint8_t* cend, pattern_t pattern)
{
    const uint8_t wildcard = pattern.wildcard;
    const uint8_t replace_wildcard = pattern.replace_wildcard;
    auto comparer = [&wildcard](uint8_t val1, uint8_t val2)
    {
        return (val1 == val2 || (wildcard && val2 == wildcard));
    };
    auto comparer2 = [&replace_wildcard](uint8_t val, uint8_t val2)
    {
        if (!replace_wildcard)
            return val;
        else if (val == replace_wildcard)
        {
            return val2;
        }

        return val;
    };
    int found = 0;
    for (;;)
    {
        uint8_t* res = std::search(cstart, cend, pattern.patt.begin(), pattern.patt.end(), comparer);
        if (res >= cend)
        {
            if(!found)
                std::cout << indent << "Warning: <" << pattern.name << "> was not found!" << std::endl;
            break;
        }
        found++;
        std::cout << indent << "Found <" << pattern.name << "> at 0x" << std::hex << (res-cstart) << std::endl;
        bool patch = true;
        if (!pattern.validate.empty())
        {
            auto found = std::search(res, res + pattern.validate.size() + 5, pattern.validate.begin(), pattern.validate.end(), comparer);
            if (found >= res + pattern.validate.size() + 5)
            {
                patch = force_invalid;
            }
        }
        if (!pattern.replace.empty())
        {
            if (patch)
            {
                std::cout << indent << "Patching..." << std::endl;
                std::transform(pattern.replace.begin(), pattern.replace.end(), res + pattern.replace_offset, res + pattern.replace_offset, comparer2);
            }
            else
            {
                std::cout << indent << "Can't apply patch! (search region don't pass validation), use -force_invalid to force." << std::endl;
            }
        }
        if (!pattern.childs.empty())
        {
            for (auto child : pattern.childs)
            {
                std::cout << indent << "Scanning SUB:<" << child.name << ">" << std::endl;
                auto end = child.max_search ? res + child.max_search : cend;
                indent += "...";
                search_and_patch_r(indent, res, end, child);
            }
        }
        cstart = res + pattern.patt.size();
    }
}